

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

char * b_str2int(char *s,int base,lua_Integer *pn)

{
  bool bVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long local_48;
  int local_3c;
  int digit;
  int neg;
  lua_Unsigned n;
  lua_Integer *pn_local;
  byte *pbStack_18;
  int base_local;
  char *s_local;
  
  _digit = 0;
  bVar1 = false;
  sVar2 = strspn(s," \f\n\r\t\v");
  pbStack_18 = (byte *)(s + sVar2);
  if (*pbStack_18 == 0x2d) {
    pbStack_18 = pbStack_18 + 1;
    bVar1 = true;
  }
  else if (*pbStack_18 == 0x2b) {
    pbStack_18 = pbStack_18 + 1;
  }
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[(int)(uint)*pbStack_18] & 8) == 0) {
    s_local = (char *)0x0;
  }
  else {
    do {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)*pbStack_18] & 0x800) == 0) {
        local_3c = toupper((uint)*pbStack_18);
        local_3c = local_3c + -0x37;
      }
      else {
        local_3c = (char)*pbStack_18 + -0x30;
      }
      if (base <= local_3c) {
        return (char *)0x0;
      }
      local_48 = _digit * base + (long)local_3c;
      pbStack_18 = pbStack_18 + 1;
      ppuVar3 = __ctype_b_loc();
      _digit = local_48;
    } while (((*ppuVar3)[(int)(uint)*pbStack_18] & 8) != 0);
    sVar2 = strspn((char *)pbStack_18," \f\n\r\t\v");
    s_local = (char *)(pbStack_18 + sVar2);
    if (bVar1) {
      local_48 = -local_48;
    }
    *pn = local_48;
  }
  return s_local;
}

Assistant:

static const char *b_str2int (const char *s, int base, lua_Integer *pn) {
  lua_Unsigned n = 0;
  int neg = 0;
  s += strspn(s, SPACECHARS);  /* skip initial spaces */
  if (*s == '-') { s++; neg = 1; }  /* handle signal */
  else if (*s == '+') s++;
  if (!isalnum((unsigned char)*s))  /* no digit? */
    return NULL;
  do {
    int digit = (isdigit((unsigned char)*s)) ? *s - '0'
                   : (toupper((unsigned char)*s) - 'A') + 10;
    if (digit >= base) return NULL;  /* invalid numeral */
    n = n * base + digit;
    s++;
  } while (isalnum((unsigned char)*s));
  s += strspn(s, SPACECHARS);  /* skip trailing spaces */
  *pn = (lua_Integer)((neg) ? (0u - n) : n);
  return s;
}